

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_vector.h
# Opt level: O3

SortedVector * __thiscall
wasm::SortedVector::merge
          (SortedVector *__return_storage_ptr__,SortedVector *this,SortedVector *other)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  
  (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
             ((long)(other->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(other->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) +
             ((long)(this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2));
  puVar3 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar10 = (long)puVar4 - (long)puVar3 >> 2;
  if (puVar4 == puVar3) {
    uVar11 = 0;
    uVar9 = 0;
    uVar7 = 0;
  }
  else {
    puVar4 = (other->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (other->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar6 = (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = 0;
    uVar7 = 0;
    uVar9 = 0;
    uVar11 = 0;
    do {
      if ((ulong)((long)puVar5 - (long)puVar4 >> 2) <= (ulong)uVar9) break;
      uVar1 = puVar3[uVar12];
      uVar2 = puVar4[uVar9];
      if (uVar1 < uVar2) {
        puVar6[uVar7] = uVar1;
        uVar11 = uVar11 + 1;
      }
      else {
        if (uVar2 < uVar1) {
          puVar6[uVar7] = uVar2;
        }
        else {
          puVar6[uVar7] = uVar1;
          uVar11 = uVar11 + 1;
        }
        uVar9 = uVar9 + 1;
      }
      uVar7 = (ulong)((int)uVar7 + 1);
      uVar12 = (ulong)uVar11;
    } while (uVar12 < uVar10);
  }
  uVar12 = (ulong)uVar11;
  if (uVar12 < uVar10) {
    puVar4 = (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = uVar7;
    do {
      uVar11 = uVar11 + 1;
      uVar7 = (ulong)((int)uVar8 + 1);
      puVar4[uVar8] = puVar3[uVar12];
      uVar12 = (ulong)uVar11;
      uVar8 = uVar7;
    } while (uVar12 < uVar10);
  }
  uVar11 = (uint)uVar7;
  puVar3 = (other->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = (long)(other->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar3 >> 2;
  uVar12 = (ulong)uVar9;
  if (uVar12 < uVar10) {
    puVar4 = (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      uVar9 = uVar9 + 1;
      uVar11 = (int)uVar7 + 1;
      puVar4[uVar7] = puVar3[uVar12];
      uVar12 = (ulong)uVar9;
      uVar7 = (ulong)uVar11;
    } while (uVar12 < uVar10);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
             (ulong)uVar11);
  return __return_storage_ptr__;
}

Assistant:

SortedVector merge(const SortedVector& other) const {
    SortedVector ret;
    ret.resize(size() + other.size());
    Index i = 0, j = 0, t = 0;
    while (i < size() && j < other.size()) {
      auto left = (*this)[i];
      auto right = other[j];
      if (left < right) {
        ret[t++] = left;
        i++;
      } else if (left > right) {
        ret[t++] = right;
        j++;
      } else {
        ret[t++] = left;
        i++;
        j++;
      }
    }
    while (i < size()) {
      ret[t++] = (*this)[i];
      i++;
    }
    while (j < other.size()) {
      ret[t++] = other[j];
      j++;
    }
    ret.resize(t);
    return ret;
  }